

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_get_tile_size(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  int *piVar2;
  _Bool _Var3;
  aom_codec_err_t aVar4;
  undefined8 *puVar5;
  int tile_height;
  int tile_width;
  int local_10;
  int local_c;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar5 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar5 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar5 + 1;
  }
  piVar2 = (int *)*puVar5;
  if (piVar2 == (int *)0x0) {
    aVar4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (ctx->frame_worker == (AVxWorker *)0x0) {
    aVar4 = AOM_CODEC_ERROR;
  }
  else {
    _Var3 = av1_get_uniform_tile_size
                      ((AV1_COMMON *)(*ctx->frame_worker->data1 + 0x3b60),&local_c,&local_10);
    aVar4 = AOM_CODEC_CORRUPT_FRAME;
    if (_Var3) {
      *piVar2 = local_c * 0x40000 + local_10 * 4;
      aVar4 = AOM_CODEC_OK;
    }
  }
  return aVar4;
}

Assistant:

static aom_codec_err_t ctrl_get_tile_size(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  unsigned int *const tile_size = va_arg(args, unsigned int *);
  AVxWorker *const worker = ctx->frame_worker;

  if (tile_size) {
    if (worker) {
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1_COMMON *const cm = &frame_worker_data->pbi->common;
      int tile_width, tile_height;
      if (!av1_get_uniform_tile_size(cm, &tile_width, &tile_height)) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      *tile_size = ((tile_width * MI_SIZE) << 16) + tile_height * MI_SIZE;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }
  return AOM_CODEC_INVALID_PARAM;
}